

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

bool __thiscall
SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Prepend
          (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *this,
          ArenaAllocator *allocator,BranchInstr **data)

{
  Type pSVar1;
  
  pSVar1 = (Type)new<Memory::ArenaAllocator>(0x10,allocator,0x35916e);
  pSVar1[1].next = (Type)*data;
  pSVar1->next = (this->super_SListNodeBase<Memory::ArenaAllocator>).next;
  (this->super_SListNodeBase<Memory::ArenaAllocator>).next = pSVar1;
  (this->super_RealCount).count = (this->super_RealCount).count + 1;
  return true;
}

Assistant:

bool Prepend(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            newNode->Next() = this->Next();
            this->Next() = newNode;
            this->IncrementCount();
            return true;
        }
        return false;
    }